

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lf_heter_queue.h
# Opt level: O0

put_transaction<Func> * __thiscall
density::
lf_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,void()>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)0,(density::consistency_model)1>
::
try_start_emplace<density_tests::LfFunctionQueueSamples<(density::function_type_erasure)0,(density::concurrency_cardinality)1,(density::concurrency_cardinality)0,(density::consistency_model)1>::func_queue_try_put_samples(std::ostream&)::Func>
          (put_transaction<Func> *__return_storage_ptr__,
          lf_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,void()>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)0,(density::consistency_model)1>
          *this,progress_guarantee i_progress_guarantee)

{
  FunctionRuntimeType<(density::function_type_erasure)0,_void_()> *pFVar1;
  FunctionRuntimeType<(density::function_type_erasure)0,_void_()> FVar2;
  put_transaction<Func> local_90;
  FunctionRuntimeType<(density::function_type_erasure)0,_void_()> *local_70;
  FunctionRuntimeType<(density::function_type_erasure)0,_void_()> *type_storage;
  runtime_type *type;
  undefined1 local_58 [7];
  bool is_noexcept;
  undefined1 local_38 [8];
  Allocation push_data;
  progress_guarantee i_progress_guarantee_local;
  lf_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  *this_local;
  
  push_data.m_user_storage._4_4_ = i_progress_guarantee;
  detail::
  LFQueue_Base<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,void()>,density::basic_default_allocator<65536ul>,density::detail::LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,void()>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)1,(density::consistency_model)1>>
  ::try_inplace_allocate<1ul,true,16ul,8ul>((Allocation *)local_38,this,i_progress_guarantee);
  if (push_data.m_next_ptr == 0) {
    memset(local_58,0,0x20);
    lf_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
    ::put_transaction<Func>::put_transaction((put_transaction<Func> *)local_58);
    put_transaction<density_tests::LfFunctionQueueSamples<(density::function_type_erasure)0,(density::concurrency_cardinality)1,(density::concurrency_cardinality)0,(density::consistency_model)1>::func_queue_try_put_samples(std::ostream&)::Func>
    ::
    put_transaction<density_tests::LfFunctionQueueSamples<(density::function_type_erasure)0,(density::concurrency_cardinality)1,(density::concurrency_cardinality)0,(density::consistency_model)1>::func_queue_try_put_samples(std::ostream&)::Func,void>
              ((put_transaction<density_tests::LfFunctionQueueSamples<(density::function_type_erasure)0,(density::concurrency_cardinality)1,(density::concurrency_cardinality)0,(density::consistency_model)1>::func_queue_try_put_samples(std::ostream&)::Func>
                *)__return_storage_ptr__,(put_transaction<Func> *)local_58);
    lf_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
    ::put_transaction<Func>::~put_transaction((put_transaction<Func> *)local_58);
  }
  else {
    type._7_1_ = 1;
    type_storage = (FunctionRuntimeType<(density::function_type_erasure)0,_void_()> *)0x0;
    pFVar1 = detail::
             LFQueue_Base<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_density::detail::LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)1>_>
             ::type_after_control((ControlBlock *)local_38);
    local_70 = pFVar1;
    FVar2 = detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>::make<Func>();
    *pFVar1 = FVar2;
    type_storage = pFVar1;
    memset((void *)push_data.m_next_ptr,0,0x10);
    lf_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
    ::put_transaction<Func>::put_transaction
              (&local_90,0,
               (lf_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
                *)this,(Allocation *)local_38);
    put_transaction<density_tests::LfFunctionQueueSamples<(density::function_type_erasure)0,(density::concurrency_cardinality)1,(density::concurrency_cardinality)0,(density::consistency_model)1>::func_queue_try_put_samples(std::ostream&)::Func>
    ::
    put_transaction<density_tests::LfFunctionQueueSamples<(density::function_type_erasure)0,(density::concurrency_cardinality)1,(density::concurrency_cardinality)0,(density::consistency_model)1>::func_queue_try_put_samples(std::ostream&)::Func,void>
              ((put_transaction<density_tests::LfFunctionQueueSamples<(density::function_type_erasure)0,(density::concurrency_cardinality)1,(density::concurrency_cardinality)0,(density::consistency_model)1>::func_queue_try_put_samples(std::ostream&)::Func>
                *)__return_storage_ptr__,&local_90);
    lf_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
    ::put_transaction<Func>::~put_transaction(&local_90);
  }
  return __return_storage_ptr__;
}

Assistant:

put_transaction<ELEMENT_TYPE>
          try_start_emplace(progress_guarantee i_progress_guarantee, CONSTRUCTION_PARAMS &&... i_construction_params) noexcept(
            noexcept(ELEMENT_TYPE(std::forward<CONSTRUCTION_PARAMS>(i_construction_params)...)) &&
            noexcept(runtime_type(runtime_type::template make<ELEMENT_TYPE>())))
        {
            auto push_data = Base::template try_inplace_allocate<
              detail::LfQueue_Busy,
              true,
              detail::size_of<ELEMENT_TYPE>::value,
              alignof(ELEMENT_TYPE)>(i_progress_guarantee);
            if (push_data.m_user_storage == nullptr)
            {
                return put_transaction<ELEMENT_TYPE>();
            }

            constexpr bool is_noexcept =
              std::is_nothrow_constructible<ELEMENT_TYPE, CONSTRUCTION_PARAMS...>::value &&
              noexcept(runtime_type(runtime_type::template make<ELEMENT_TYPE>()));

            runtime_type * type = nullptr;

            if (is_noexcept)
            {
                auto const type_storage = Base::type_after_control(push_data.m_control_block);
                DENSITY_ASSUME(type_storage != nullptr);
                type = new (type_storage) runtime_type(runtime_type::template make<ELEMENT_TYPE>());

                DENSITY_ASSUME(push_data.m_user_storage != nullptr);
                new (push_data.m_user_storage)
                  ELEMENT_TYPE(std::forward<CONSTRUCTION_PARAMS>(i_construction_params)...);
            }
            else
            {
                try
                {
                    auto const type_storage = Base::type_after_control(push_data.m_control_block);
                    DENSITY_ASSUME(type_storage != nullptr);
                    type =
                      new (type_storage) runtime_type(runtime_type::template make<ELEMENT_TYPE>());

                    DENSITY_ASSUME(push_data.m_user_storage != nullptr);
                    new (push_data.m_user_storage)
                      ELEMENT_TYPE(std::forward<CONSTRUCTION_PARAMS>(i_construction_params)...);
                }
                catch (...)
                {
                    if (type != nullptr)
                        type->RUNTIME_TYPE::~RUNTIME_TYPE();

                    Base::cancel_put_nodestroy_impl(push_data);
                    DENSITY_INTERNAL_RETHROW_FROM_NOEXCEPT
                }
            }

            return put_transaction<ELEMENT_TYPE>(PrivateType(), this, push_data);
        }